

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eepromtool.c
# Opt level: O0

void eepromtool(char *ifname,int slave,int mode,char *fname)

{
  uint slave_00;
  uint16 uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uint16 *wbuf;
  int esize;
  int estart;
  int rc;
  int w;
  char *fname_local;
  int mode_local;
  int slave_local;
  char *ifname_local;
  
  esize = 0;
  _rc = fname;
  fname_local._0_4_ = mode;
  fname_local._4_4_ = slave;
  _mode_local = ifname;
  iVar2 = ec_init(ifname);
  if (iVar2 == 0) {
    printf("No socket connection on %s\nExcecute as root\n",_mode_local);
  }
  else {
    printf("ec_init on %s succeeded.\n",_mode_local);
    estart = 0;
    wkc = ec_BRD(0,0,4,&estart,20000);
    if (wkc < 1) {
      printf("No slaves found!\n");
    }
    else {
      _ec_slavecount = wkc;
      printf("%d slaves found.\n");
      if ((_ec_slavecount < (int)fname_local._4_4_) || ((int)fname_local._4_4_ < 1)) {
        printf("Slave number outside range.\n");
      }
      else {
        if ((((int)fname_local == 6) || ((int)fname_local == 1)) || ((int)fname_local == 2)) {
          esize = gettimeofday((timeval *)&tstart,(__timezone_ptr_t)0x0);
          eeprom_read(fname_local._4_4_,0,0x80);
          printf("Slave %d data\n",(ulong)fname_local._4_4_);
          printf(" PDI Control      : %4.4X\n",(ulong)(ushort)ebuf._0_2_);
          printf(" PDI Config       : %4.4X\n",(ulong)(ushort)ebuf._2_2_);
          printf(" Config Alias     : %4.4X\n",(ulong)(ushort)ebuf._8_2_);
          printf(" Checksum         : %4.4X\n",(ulong)(ushort)ebuf._14_2_);
          uVar1 = SIIcrc(ebuf);
          printf("   calculated     : %4.4X\n",(ulong)uVar1);
          printf(" Vendor ID        : %8.8X\n",(ulong)(uint)ebuf._16_4_);
          printf(" Product Code     : %8.8X\n",(ulong)(uint)ebuf._20_4_);
          printf(" Revision Number  : %8.8X\n",(ulong)(uint)ebuf._24_4_);
          printf(" Serial Number    : %8.8X\n",(ulong)(uint)ebuf._28_4_);
          printf(" Mailbox Protocol : %4.4X\n",(ulong)(ushort)ebuf._56_2_);
          wbuf._0_4_ = ((ushort)ebuf._124_2_ + 1) * 0x80;
          if (0x8000 < (uint)wbuf) {
            wbuf._0_4_ = 0x8000;
          }
          printf(" Size             : %4.4X = %d bytes\n",(ulong)(ushort)ebuf._124_2_,
                 (ulong)(uint)wbuf);
          printf(" Version          : %4.4X\n");
        }
        if (((int)fname_local == 1) || ((int)fname_local == 2)) {
          if (0x80 < (int)(uint)wbuf) {
            eeprom_read(fname_local._4_4_,0x80,(uint)wbuf - 0x80);
          }
          esize = gettimeofday((timeval *)&tend,(__timezone_ptr_t)0x0);
          tdif.tv_sec = tend.tv_sec - tstart.tv_sec;
          tdif.tv_usec = tend.tv_usec - tstart.tv_usec;
          if (tdif.tv_usec < 0) {
            tdif.tv_sec = tdif.tv_sec + -1;
            tdif.tv_usec = tdif.tv_usec + 1000000;
          }
          if ((int)fname_local == 2) {
            output_intelhex(_rc,(uint)wbuf);
          }
          if ((int)fname_local == 1) {
            output_bin(_rc,(uint)wbuf);
          }
          lVar4 = tdif.tv_usec + tdif.tv_sec * 1000000;
          printf("\nTotal EEPROM read time :%ldms\n",lVar4 / 1000,lVar4 % 1000);
        }
        if (((int)fname_local == 3) || ((int)fname_local == 4)) {
          wbuf._4_4_ = 0;
          if ((int)fname_local == 4) {
            esize = input_intelhex(_rc,(int *)((long)&wbuf + 4),(int *)&wbuf);
          }
          if ((int)fname_local == 3) {
            esize = input_bin(_rc,(int *)&wbuf);
          }
          if (esize < 1) {
            printf("Error reading file, abort.\n");
          }
          else {
            printf("Slave %d\n",(ulong)fname_local._4_4_);
            printf(" Vendor ID        : %8.8X\n",(ulong)(uint)ebuf._16_4_);
            printf(" Product Code     : %8.8X\n",(ulong)(uint)ebuf._20_4_);
            printf(" Revision Number  : %8.8X\n",(ulong)(uint)ebuf._24_4_);
            printf(" Serial Number    : %8.8X\n",(ulong)(uint)ebuf._28_4_);
            printf("Busy");
            fflush(_stdout);
            esize = gettimeofday((timeval *)&tstart,(__timezone_ptr_t)0x0);
            eeprom_write(fname_local._4_4_,wbuf._4_4_,(uint)wbuf);
            esize = gettimeofday((timeval *)&tend,(__timezone_ptr_t)0x0);
            tdif.tv_sec = tend.tv_sec - tstart.tv_sec;
            tdif.tv_usec = tend.tv_usec - tstart.tv_usec;
            if (tdif.tv_usec < 0) {
              tdif.tv_sec = tdif.tv_sec + -1;
              tdif.tv_usec = tdif.tv_usec + 1000000;
            }
            lVar4 = tdif.tv_usec + tdif.tv_sec * 1000000;
            printf("\nTotal EEPROM write time :%ldms\n",lVar4 / 1000,lVar4 % 1000);
          }
        }
        if ((int)fname_local == 5) {
          iVar3 = eeprom_read(fname_local._4_4_,0,0xe);
          slave_00 = fname_local._4_4_;
          iVar2 = alias;
          if (iVar3 == 0) {
            printf("Could not read slave EEPROM");
          }
          else {
            ebuf._8_2_ = (undefined2)alias;
            uVar1 = SIIcrc(ebuf);
            iVar2 = eeprom_writealias(slave_00,iVar2,uVar1);
            if (iVar2 == 0) {
              printf("Alias not written\n");
            }
            else {
              printf("Alias %4.4X written successfully to slave %d\n",(ulong)(uint)alias,
                     (ulong)fname_local._4_4_);
            }
          }
        }
      }
    }
    printf("End, close socket\n");
    ec_close();
  }
  return;
}

Assistant:

void eepromtool(char *ifname, int slave, int mode, char *fname)
{
   int w, rc = 0, estart, esize;
   uint16 *wbuf;
   
   /* initialise SOEM, bind socket to ifname */
   if (ec_init(ifname))
   {   
      printf("ec_init on %s succeeded.\n",ifname);

      w = 0x0000;
       wkc = ec_BRD(0x0000, ECT_REG_TYPE, sizeof(w), &w, EC_TIMEOUTSAFE);      /* detect number of slaves */
       if (wkc > 0)
       {
         ec_slavecount = wkc;

         printf("%d slaves found.\n",ec_slavecount);
         if((ec_slavecount >= slave) && (slave > 0))
         {
            if ((mode == MODE_INFO) || (mode == MODE_READBIN) || (mode == MODE_READINTEL))
            {
               rc =  gettimeofday(&tstart, NULL);
               eeprom_read(slave, 0x0000, MINBUF); // read first 128 bytes

               wbuf = (uint16 *)&ebuf[0];
               printf("Slave %d data\n", slave);
               printf(" PDI Control      : %4.4X\n",*(wbuf + 0x00));
               printf(" PDI Config       : %4.4X\n",*(wbuf + 0x01));
               printf(" Config Alias     : %4.4X\n",*(wbuf + 0x04));
               printf(" Checksum         : %4.4X\n",*(wbuf + 0x07));
               printf("   calculated     : %4.4X\n",SIIcrc(&ebuf[0])); 
               printf(" Vendor ID        : %8.8X\n",*(uint32 *)(wbuf + 0x08));
               printf(" Product Code     : %8.8X\n",*(uint32 *)(wbuf + 0x0A));
               printf(" Revision Number  : %8.8X\n",*(uint32 *)(wbuf + 0x0C));
               printf(" Serial Number    : %8.8X\n",*(uint32 *)(wbuf + 0x0E));
               printf(" Mailbox Protocol : %4.4X\n",*(wbuf + 0x1C));
               esize = (*(wbuf + 0x3E) + 1) * 128;
               if (esize > MAXBUF) esize = MAXBUF;
               printf(" Size             : %4.4X = %d bytes\n",*(wbuf + 0x3E), esize);
               printf(" Version          : %4.4X\n",*(wbuf + 0x3F));
            }
            if ((mode == MODE_READBIN) || (mode == MODE_READINTEL))
            {
               if (esize > MINBUF)
                  eeprom_read(slave, MINBUF, esize - MINBUF); // read reminder

               rc =  gettimeofday(&tend, NULL);
               timersub(&tend, &tstart, &tdif);
               if (mode == MODE_READINTEL) output_intelhex(fname, esize);
               if (mode == MODE_READBIN)   output_bin(fname, esize);

               printf("\nTotal EEPROM read time :%ldms\n", (tdif.tv_usec+(tdif.tv_sec*1000000L)) / 1000);
            }
            if ((mode == MODE_WRITEBIN) || (mode == MODE_WRITEINTEL))
            {
               estart = 0;
               if (mode == MODE_WRITEINTEL) rc = input_intelhex(fname, &estart, &esize);
               if (mode == MODE_WRITEBIN)   rc = input_bin(fname, &esize);

               if (rc > 0)
               {               
                  wbuf = (uint16 *)&ebuf[0];
                  printf("Slave %d\n", slave);
                  printf(" Vendor ID        : %8.8X\n",*(uint32 *)(wbuf + 0x08));
                  printf(" Product Code     : %8.8X\n",*(uint32 *)(wbuf + 0x0A));
                  printf(" Revision Number  : %8.8X\n",*(uint32 *)(wbuf + 0x0C));
                  printf(" Serial Number    : %8.8X\n",*(uint32 *)(wbuf + 0x0E));

                  printf("Busy");
                  fflush(stdout);
                  rc =  gettimeofday(&tstart, NULL);
                  eeprom_write(slave, estart, esize);
                  rc =  gettimeofday(&tend, NULL);               
                  timersub(&tend, &tstart, &tdif);

                  printf("\nTotal EEPROM write time :%ldms\n", (tdif.tv_usec+(tdif.tv_sec*1000000L)) / 1000);
               }
               else
                  printf("Error reading file, abort.\n"); 
            }
            if (mode == MODE_WRITEALIAS)
            {
               if( eeprom_read(slave, 0x0000, CRCBUF) ) // read first 14 bytes
               {
                  wbuf = (uint16 *)&ebuf[0];
                  *(wbuf + 0x04) = alias;  
                  if(eeprom_writealias(slave, alias, SIIcrc(&ebuf[0])))
                  {
                     printf("Alias %4.4X written successfully to slave %d\n", alias, slave);
                  } 
                  else
                  {
                     printf("Alias not written\n");
                  }
               }  
               else
               {
                  printf("Could not read slave EEPROM");    
               }
            }
         }
         else
         {
            printf("Slave number outside range.\n");
         }
      }
      else
      {
         printf("No slaves found!\n");
      }
      printf("End, close socket\n");
      /* stop SOEM, close socket */
      ec_close();
   }
   else
   {
      printf("No socket connection on %s\nExcecute as root\n",ifname);
   }
}